

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O3

void do_undisguise(CHAR_DATA *ch,char *argument)

{
  OLD_CHAR *pOVar1;
  bool bVar2;
  int iVar3;
  char *txt;
  
  bVar2 = is_affected(ch,(int)gsn_disguise);
  if ((bVar2) && (pOVar1 = ch->pcdata->old, pOVar1 != (OLD_CHAR *)0x0)) {
    act("$n suddenly slips out of $s garb... revealing $t beneath the disguise!",ch,pOVar1->name,
        (void *)0x0,0);
    act("You deftly slip out of your disguise and cast it aside.",ch,(void *)0x0,(void *)0x0,3);
    switchD_002dea30::default(ch,(int)gsn_disguise);
    WAIT_STATE(ch,0x18);
    return;
  }
  iVar3 = get_skill(ch,(int)gsn_disguise);
  if (iVar3 < 1) {
    txt = "Huh?\n\r";
  }
  else {
    txt = "You are not disguised!\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_undisguise(CHAR_DATA *ch, char *argument)
{
	if (!is_affected(ch, gsn_disguise) || !ch->pcdata->old)
	{
		if (get_skill(ch, gsn_disguise) < 1)
		{
			send_to_char("Huh?\n\r", ch);
			return;
		}
		else
		{
			send_to_char("You are not disguised!\n\r", ch);
			return;
		}
	}

	act("$n suddenly slips out of $s garb... revealing $t beneath the disguise!", ch, ch->pcdata->old->name, 0, TO_ROOM);
	act("You deftly slip out of your disguise and cast it aside.", ch, 0, 0, TO_CHAR);

	affect_strip(ch, gsn_disguise);

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}